

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniforms.cpp
# Opt level: O1

void __thiscall Uniforms::flagChange(Uniforms *this)

{
  Camera *pCVar1;
  _Rb_tree_node_base *p_Var2;
  
  this->m_change = true;
  pCVar1 = (this->super_Scene).activeCamera;
  if (pCVar1 != (Camera *)0x0) {
    (pCVar1->super_Node).bChange = true;
  }
  for (p_Var2 = (this->data)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->data)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    *(undefined1 *)((long)&p_Var2[5]._M_parent + 1) = 1;
  }
  return;
}

Assistant:

void Uniforms::flagChange() {
    m_change = true;

    if (activeCamera)
        activeCamera->bChange = true;

    // Flag all user uniforms as changed
    for (UniformDataMap::iterator it = data.begin(); it != data.end(); ++it)
        it->second.change = true;
}